

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O0

void sink_sweep_ins(jit_State *J)

{
  ushort uVar1;
  IRIns *pIVar2;
  IRIns *pIVar3;
  int local_44;
  IRIns *ira_1;
  int delta;
  IRIns *ira;
  IRIns *irbase;
  IRIns *ir;
  jit_State *J_local;
  
  pIVar2 = (J->cur).ir + 0x8000;
  for (irbase = (J->cur).ir + ((J->cur).nins - 1); pIVar2 <= irbase; irbase = irbase + -1) {
    switch((irbase->field_1).o) {
    case '\x13':
      pIVar3 = (J->cur).ir;
      uVar1 = (irbase->field_0).op2;
      if ((((&pIVar3->field_1)[uVar1].t.irt & 0x20) == 0) &&
         (((((&pIVar3->field_1)[uVar1].o == 'Q' || ((&pIVar3->field_1)[uVar1].o == 'R')) ||
           ((&pIVar3->field_1)[uVar1].o == 'S')) || ((&pIVar3->field_1)[uVar1].o == 'T')))) {
        (irbase->field_0).prev = 0xfe;
      }
      else {
        (irbase->field_0).prev = 0xff;
      }
      break;
    default:
      (irbase->field_1).t.irt = (irbase->field_1).t.irt & 0xdf;
      (irbase->field_0).prev = 0xff;
      break;
    case ';':
      if ((*(byte *)((long)(J->cur).ir + (ulong)(irbase->field_0).op1 * 8 + 4) & 0x20) == 0) {
        (irbase->field_0).prev = 0xfe;
      }
      else {
        (irbase->field_1).t.irt = (irbase->field_1).t.irt & 0xdf;
        (irbase->field_0).prev = 0xff;
      }
      break;
    case 'J':
    case 'K':
    case 'M':
    case 'N':
      pIVar3 = sink_checkalloc(J,irbase);
      if ((pIVar3 == (IRIns *)0x0) || (((pIVar3->field_1).t.irt & 0x20) != 0)) {
        (irbase->field_0).prev = 0xff;
      }
      else {
        local_44 = (int)((long)irbase - (long)pIVar3 >> 3);
        if (0xff < local_44) {
          local_44 = 0xff;
        }
        (irbase->field_0).prev = (short)(local_44 << 8) + 0xfe;
      }
      break;
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
      if (((irbase->field_1).t.irt & 0x20) == 0) {
        (irbase->field_1).t.irt = (irbase->field_1).t.irt & 0x7f;
        (irbase->field_0).prev = 0xfe;
        (J->cur).sinktags = '\x01';
      }
      else {
        (irbase->field_1).t.irt = (irbase->field_1).t.irt & 0xdf;
        (irbase->field_0).prev = 0xff;
      }
    }
  }
  for (irbase = (J->cur).ir + (J->cur).nk; irbase < pIVar2; irbase = irbase + 1) {
    (irbase->field_1).t.irt = (irbase->field_1).t.irt & 0xdf;
    (irbase->field_0).prev = 0xff;
    if (((0x605fd9U >> ((irbase->field_1).t.irt & 0x1f) & 1) != 0) &&
       ((irbase->field_1).o != '\x1b')) {
      irbase = irbase + 1;
    }
  }
  return;
}

Assistant:

static void sink_sweep_ins(jit_State *J)
{
  IRIns *ir, *irbase = IR(REF_BASE);
  for (ir = IR(J->cur.nins-1) ; ir >= irbase; ir--) {
    switch (ir->o) {
    case IR_ASTORE: case IR_HSTORE: case IR_FSTORE: case IR_XSTORE: {
      IRIns *ira = sink_checkalloc(J, ir);
      if (ira && !irt_ismarked(ira->t)) {
	int delta = (int)(ir - ira);
	ir->prev = REGSP(RID_SINK, delta > 255 ? 255 : delta);
      } else {
	ir->prev = REGSP_INIT;
      }
      break;
      }
    case IR_NEWREF:
      if (!irt_ismarked(IR(ir->op1)->t)) {
	ir->prev = REGSP(RID_SINK, 0);
      } else {
	irt_clearmark(ir->t);
	ir->prev = REGSP_INIT;
      }
      break;
#if LJ_HASFFI
    case IR_CNEW: case IR_CNEWI:
#endif
    case IR_TNEW: case IR_TDUP:
      if (!irt_ismarked(ir->t)) {
	ir->t.irt &= ~IRT_GUARD;
	ir->prev = REGSP(RID_SINK, 0);
	J->cur.sinktags = 1;  /* Signal present SINK tags to assembler. */
      } else {
	irt_clearmark(ir->t);
	ir->prev = REGSP_INIT;
      }
      break;
    case IR_PHI: {
      IRIns *ira = IR(ir->op2);
      if (!irt_ismarked(ira->t) &&
	  (ira->o == IR_TNEW || ira->o == IR_TDUP ||
	   (LJ_HASFFI && (ira->o == IR_CNEW || ira->o == IR_CNEWI)))) {
	ir->prev = REGSP(RID_SINK, 0);
      } else {
	ir->prev = REGSP_INIT;
      }
      break;
      }
    default:
      irt_clearmark(ir->t);
      ir->prev = REGSP_INIT;
      break;
    }
  }
  for (ir = IR(J->cur.nk); ir < irbase; ir++) {
    irt_clearmark(ir->t);
    ir->prev = REGSP_INIT;
    /* The false-positive of irt_is64() for ASMREF_L (REF_NIL) is OK here. */
    if (irt_is64(ir->t) && ir->o != IR_KNULL)
      ir++;
  }
}